

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OFFReader.cc
# Opt level: O0

bool __thiscall OpenMesh::IO::_OFFReader_::can_u_read(_OFFReader_ *this,string *_filename)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  istream local_228 [8];
  ifstream ifs;
  string *_filename_local;
  _OFFReader_ *this_local;
  
  bVar1 = BaseReader::can_u_read(&this->super_BaseReader,_filename);
  if (bVar1) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(local_228,pcVar3,_S_in);
    bVar2 = std::ifstream::is_open();
    if (((bVar2 & 1) == 0) || (bVar1 = can_u_read(this,local_228), !bVar1)) {
      bVar1 = false;
    }
    else {
      std::ifstream::close();
      this_local._7_1_ = 1;
      bVar1 = true;
    }
    std::ifstream::~ifstream(local_228);
    if (bVar1) goto LAB_0030a493;
  }
  this_local._7_1_ = 0;
LAB_0030a493:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool _OFFReader_::can_u_read(const std::string& _filename) const
{
  // !!! Assuming BaseReader::can_u_parse( std::string& )
  // does not call BaseReader::read_magic()!!!
  if (BaseReader::can_u_read(_filename))
  {
    std::ifstream ifs(_filename.c_str());
    if (ifs.is_open() && can_u_read(ifs))
    {
      ifs.close();
      return true;
    }
  }
  return false;
}